

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.hpp
# Opt level: O0

bool __thiscall
boost::detail::multi_array::
array_iterator<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*const*,mpl_::size_t<2ul>,boost::detail::multi_array::const_sub_array<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,1ul,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*const*>,boost::random_access_traversal_tag>
::
equal<boost::detail::multi_array::array_iterator<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*const*,mpl_::size_t<2ul>,boost::detail::multi_array::const_sub_array<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,1ul,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*const*>,boost::random_access_traversal_tag>const>
          (array_iterator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*const_*,_mpl_::size_t<2UL>,_boost::detail::multi_array::const_sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*const_*>,_boost::random_access_traversal_tag>
           *this,array_iterator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*const_*,_mpl_::size_t<2UL>,_boost::detail::multi_array::const_sub_array<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_1UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*const_*>,_boost::random_access_traversal_tag>
                 *rhs)

{
  bool bVar1;
  long *in_RSI;
  long *in_RDI;
  size_t N;
  unsigned_long *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  bool local_19;
  
  local_19 = false;
  if ((*in_RDI == *in_RSI) && (local_19 = false, in_RDI[1] == in_RSI[1])) {
    if ((in_RDI[2] != in_RSI[2]) &&
       (bVar1 = std::equal<unsigned_long_const*,unsigned_long_const*>
                          ((unsigned_long *)
                           CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                           in_stack_ffffffffffffffc8,(unsigned_long *)0x949b69), !bVar1)) {
      return false;
    }
    if ((in_RDI[3] != in_RSI[3]) &&
       (bVar1 = std::equal<long_const*,long_const*>
                          ((long *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                           (long *)in_stack_ffffffffffffffc8,(long *)0x949bae), !bVar1)) {
      return false;
    }
    local_19 = true;
    if (in_RDI[4] != in_RSI[4]) {
      local_19 = std::equal<long_const*,long_const*>
                           ((long *)CONCAT17(1,in_stack_ffffffffffffffd0),
                            (long *)in_stack_ffffffffffffffc8,(long *)0x949bf6);
    }
  }
  return local_19;
}

Assistant:

bool equal(IteratorAdaptor& rhs) const {
    const std::size_t N = NumDims::value;
    return (idx_ == rhs.idx_) &&
      (base_ == rhs.base_) &&
      ( (extents_ == rhs.extents_) ||
        std::equal(extents_,extents_+N,rhs.extents_) ) &&
      ( (strides_ == rhs.strides_) ||
        std::equal(strides_,strides_+N,rhs.strides_) ) &&
      ( (index_base_ == rhs.index_base_) ||
        std::equal(index_base_,index_base_+N,rhs.index_base_) );
  }